

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall CVmObjStringBuffer::apply_undo(CVmObjStringBuffer *this,CVmUndoRecord *undo_rec)

{
  int32_t del_chars;
  int iVar1;
  CVmObjStringBuffer *in_RSI;
  wchar_t *in_RDI;
  int unaff_retaddr;
  vm_obj_id_t self;
  strbuf_undo_rec *rec;
  int in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  vm_obj_id_t self_00;
  undefined4 in_stack_ffffffffffffffe0;
  int *__ptr;
  
  if ((in_RSI->super_CVmObject).ext_ != (char *)0x0) {
    del_chars = *(int32_t *)&(in_RSI->super_CVmObject)._vptr_CVmObject;
    __ptr = (int *)(in_RSI->super_CVmObject).ext_;
    iVar1 = *__ptr;
    self_00 = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
    if (iVar1 == 0) {
      delete_text((CVmObjStringBuffer *)CONCAT44(del_chars,in_stack_ffffffffffffffe0),self_00,
                  (int32_t)in_RDI,0,in_stack_ffffffffffffffd0);
    }
    else if (iVar1 == 1) {
      insert_text((CVmObjStringBuffer *)CONCAT44(del_chars,in_stack_ffffffffffffffe0),self_00,
                  (int32_t)in_RDI,(wchar_t *)CONCAT44(1,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    else if (iVar1 == 2) {
      splice_text(in_RSI,(vm_obj_id_t)((ulong)__ptr >> 0x20),(int32_t)__ptr,del_chars,in_RDI,2,
                  unaff_retaddr);
    }
    free(__ptr);
    (in_RSI->super_CVmObject).ext_ = (char *)0x0;
  }
  return;
}

Assistant:

void CVmObjStringBuffer::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        strbuf_undo_rec *rec;
        vm_obj_id_t self = undo_rec->obj;

        /* get our private record from the standard undo record */
        rec = (strbuf_undo_rec *)undo_rec->id.ptrval;

        /* check the action in the record */
        switch(rec->action)
        {
        case STRBUF_UNDO_INS:
            /* we inserted text into the buffer; delete the new text */
            delete_text(vmg_ self, rec->idx, rec->new_len, FALSE);
            break;

        case STRBUF_UNDO_DEL:
            /* we deleted text; re-insert the old text */
            insert_text(vmg_ self, rec->idx, rec->str, rec->old_len, FALSE);
            break;

        case STRBUF_UNDO_REPL:
            /* we replaced text; splice the old text in place of the new */
            splice_text(vmg_ self,
                        rec->idx, rec->new_len, rec->str, rec->old_len,
                        FALSE);
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}